

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

double __thiscall
chrono::fea::ChElementShellANCF_3423::Calc_detJ0
          (ChElementShellANCF_3423 *this,double x,double y,double z,ShapeVector *Nx,ShapeVector *Ny,
          ShapeVector *Nz,ChMatrixNM<double,_1,_3> *Nx_d0,ChMatrixNM<double,_1,_3> *Ny_d0,
          ChMatrixNM<double,_1,_3> *Nz_d0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ActualDstType actualDst;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  
  dVar29 = y;
  ShapeFunctionsDerivativeX(this,Nx,x,y,z);
  ShapeFunctionsDerivativeY(this,Ny,x,dVar29,z);
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[0] = 0.0
  ;
  dVar29 = (1.0 - x) * 0.25;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[1] =
       dVar29 * (1.0 - y);
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[2] = 0.0
  ;
  dVar15 = (x + 1.0) * 0.25;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[3] =
       dVar15 * (1.0 - y);
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[4] = 0.0
  ;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[5] =
       dVar15 * (y + 1.0);
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[6] = 0.0
  ;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[7] =
       dVar29 * (y + 1.0);
  dVar29 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [0];
  dVar15 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [1];
  dVar1 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [3];
  dVar2 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [1];
  auVar30._8_8_ = dVar2;
  auVar30._0_8_ = dVar2;
  dVar2 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[2];
  dVar3 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[5];
  dVar4 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [0];
  auVar18._8_8_ = dVar4;
  auVar18._0_8_ = dVar4;
  auVar18 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             (this->m_d0).
                             super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                             m_data.array,auVar18);
  dVar4 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0xb];
  auVar18 = vfmadd132pd_fma(auVar30,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 3));
  dVar5 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [2];
  auVar19._8_8_ = dVar5;
  auVar19._0_8_ = dVar5;
  auVar18 = vfmadd132pd_fma(auVar19,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 6));
  dVar5 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [3];
  auVar31._8_8_ = dVar5;
  auVar31._0_8_ = dVar5;
  dVar5 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [2];
  dVar6 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[8];
  auVar18 = vfmadd132pd_fma(auVar31,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 9));
  dVar7 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [4];
  auVar20._8_8_ = dVar7;
  auVar20._0_8_ = dVar7;
  auVar18 = vfmadd132pd_fma(auVar20,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xc));
  dVar7 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [5];
  auVar32._8_8_ = dVar7;
  auVar32._0_8_ = dVar7;
  auVar18 = vfmadd132pd_fma(auVar32,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xf));
  dVar7 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [6];
  auVar21._8_8_ = dVar7;
  auVar21._0_8_ = dVar7;
  dVar7 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [5];
  dVar8 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0x11];
  auVar18 = vfmadd132pd_fma(auVar21,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x12));
  dVar9 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [7];
  auVar33._8_8_ = dVar9;
  auVar33._0_8_ = dVar9;
  dVar10 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [4];
  dVar11 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0xe];
  auVar18 = vfmadd231pd_fma(auVar18,auVar33,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x15));
  dVar12 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x17];
  dVar13 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [6];
  dVar14 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x14];
  *(undefined1 (*) [16])
   (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array =
       auVar18;
  (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       dVar29 * dVar2 + dVar15 * dVar3 + dVar5 * dVar6 + dVar1 * dVar4 +
       dVar10 * dVar11 + dVar7 * dVar8 + dVar13 * dVar14 + dVar9 * dVar12;
  dVar29 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [0];
  dVar15 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [1];
  dVar1 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [3];
  dVar2 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [1];
  auVar34._8_8_ = dVar2;
  auVar34._0_8_ = dVar2;
  dVar2 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[2];
  dVar3 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[5];
  dVar4 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [0];
  auVar16._8_8_ = dVar4;
  auVar16._0_8_ = dVar4;
  auVar18 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             (this->m_d0).
                             super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                             m_data.array,auVar16);
  dVar4 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0xb];
  auVar18 = vfmadd132pd_fma(auVar34,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 3));
  dVar5 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [2];
  auVar22._8_8_ = dVar5;
  auVar22._0_8_ = dVar5;
  auVar18 = vfmadd132pd_fma(auVar22,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 6));
  dVar5 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [3];
  auVar35._8_8_ = dVar5;
  auVar35._0_8_ = dVar5;
  dVar5 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [2];
  dVar6 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[8];
  auVar18 = vfmadd132pd_fma(auVar35,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 9));
  dVar7 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [4];
  auVar23._8_8_ = dVar7;
  auVar23._0_8_ = dVar7;
  auVar18 = vfmadd132pd_fma(auVar23,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xc));
  dVar7 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [5];
  auVar36._8_8_ = dVar7;
  auVar36._0_8_ = dVar7;
  auVar18 = vfmadd132pd_fma(auVar36,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xf));
  dVar7 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [6];
  auVar24._8_8_ = dVar7;
  auVar24._0_8_ = dVar7;
  dVar7 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [5];
  dVar8 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0x11];
  auVar18 = vfmadd132pd_fma(auVar24,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x12));
  dVar9 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [7];
  auVar37._8_8_ = dVar9;
  auVar37._0_8_ = dVar9;
  dVar10 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [4];
  dVar11 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0xe];
  auVar18 = vfmadd231pd_fma(auVar18,auVar37,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x15));
  dVar12 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x17];
  dVar13 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [6];
  dVar14 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x14];
  *(undefined1 (*) [16])
   (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array =
       auVar18;
  (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       dVar29 * dVar2 + dVar15 * dVar3 + dVar5 * dVar6 + dVar1 * dVar4 +
       dVar10 * dVar11 + dVar7 * dVar8 + dVar13 * dVar14 + dVar9 * dVar12;
  dVar29 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [0];
  dVar15 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [1];
  dVar1 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [3];
  dVar2 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [1];
  auVar38._8_8_ = dVar2;
  auVar38._0_8_ = dVar2;
  dVar2 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[2];
  dVar3 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[5];
  dVar4 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [0];
  auVar17._8_8_ = dVar4;
  auVar17._0_8_ = dVar4;
  auVar18 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             (this->m_d0).
                             super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                             m_data.array,auVar17);
  dVar4 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0xb];
  auVar18 = vfmadd132pd_fma(auVar38,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 3));
  dVar5 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [2];
  auVar25._8_8_ = dVar5;
  auVar25._0_8_ = dVar5;
  auVar18 = vfmadd132pd_fma(auVar25,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 6));
  dVar5 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [3];
  auVar39._8_8_ = dVar5;
  auVar39._0_8_ = dVar5;
  dVar5 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [2];
  dVar6 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[8];
  auVar18 = vfmadd132pd_fma(auVar39,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 9));
  dVar7 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [4];
  auVar26._8_8_ = dVar7;
  auVar26._0_8_ = dVar7;
  auVar18 = vfmadd132pd_fma(auVar26,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xc));
  dVar7 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [5];
  auVar40._8_8_ = dVar7;
  auVar40._0_8_ = dVar7;
  auVar18 = vfmadd132pd_fma(auVar40,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xf));
  dVar7 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [6];
  auVar27._8_8_ = dVar7;
  auVar27._0_8_ = dVar7;
  dVar7 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [5];
  dVar8 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0x11];
  auVar18 = vfmadd132pd_fma(auVar27,auVar18,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x12));
  dVar9 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [7];
  auVar41._8_8_ = dVar9;
  auVar41._0_8_ = dVar9;
  dVar10 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [4];
  dVar11 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0xe];
  auVar16 = vfmadd231pd_fma(auVar18,auVar41,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x15));
  dVar12 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x17];
  dVar13 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [6];
  dVar14 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x14];
  *(undefined1 (*) [16])
   (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array =
       auVar16;
  auVar18 = vshufpd_avx(auVar16,auVar16,1);
  dVar5 = dVar29 * dVar2 + dVar15 * dVar3 + dVar5 * dVar6 + dVar1 * dVar4 +
          dVar10 * dVar11 + dVar7 * dVar8 + dVar13 * dVar14 + dVar9 * dVar12;
  (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       dVar5;
  dVar29 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[0];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar29;
  dVar15 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[1];
  dVar1 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar1;
  dVar2 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  dVar3 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar4 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar4;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar5;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar1 * dVar15;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar29 * auVar18._0_8_ * dVar2;
  auVar17 = vfmadd231sd_fma(auVar49,auVar42,auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = auVar16._0_8_ * dVar3;
  auVar17 = vfmadd213sd_fma(auVar47,auVar50,auVar17);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar2 * dVar15;
  auVar16 = vfnmadd213sd_fma(auVar44,auVar16,auVar17);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar4 * auVar18._0_8_;
  auVar18 = vfnmadd213sd_fma(auVar48,auVar45,auVar16);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar3 * dVar5;
  auVar18 = vfnmadd213sd_fma(auVar28,auVar43,auVar18);
  return auVar18._0_8_;
}

Assistant:

double ChElementShellANCF_3423::Calc_detJ0(double x,
                                           double y,
                                           double z,
                                           ShapeVector& Nx,
                                           ShapeVector& Ny,
                                           ShapeVector& Nz,
                                           ChMatrixNM<double, 1, 3>& Nx_d0,
                                           ChMatrixNM<double, 1, 3>& Ny_d0,
                                           ChMatrixNM<double, 1, 3>& Nz_d0) {
    ShapeFunctionsDerivativeX(Nx, x, y, z);
    ShapeFunctionsDerivativeY(Ny, x, y, z);
    ShapeFunctionsDerivativeZ(Nz, x, y, z);

    Nx_d0 = Nx * m_d0;
    Ny_d0 = Ny * m_d0;
    Nz_d0 = Nz * m_d0;

    double detJ0 = Nx_d0(0, 0) * Ny_d0(0, 1) * Nz_d0(0, 2) + Ny_d0(0, 0) * Nz_d0(0, 1) * Nx_d0(0, 2) +
                   Nz_d0(0, 0) * Nx_d0(0, 1) * Ny_d0(0, 2) - Nx_d0(0, 2) * Ny_d0(0, 1) * Nz_d0(0, 0) -
                   Ny_d0(0, 2) * Nz_d0(0, 1) * Nx_d0(0, 0) - Nz_d0(0, 2) * Nx_d0(0, 1) * Ny_d0(0, 0);

    return detJ0;
}